

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset_wire_format.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_wireformat_unittest::TestMessageSet::_InternalSerialize
          (TestMessageSet *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  UnknownFieldSet *unknown_fields;
  
  puVar2 = google::protobuf::internal::ExtensionSet::
           InternalSerializeMessageSetWithCachedSizesToArray
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestMessageSet_default_instance_,target,stream);
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    unknown_fields =
         (UnknownFieldSet *)&google::protobuf::UnknownFieldSet::default_instance()::instance;
  }
  else {
    unknown_fields = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                     (unknown_fields,puVar2,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageSet::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
   target =
      this_._impl_._extensions_
          .InternalSerializeMessageSetWithCachedSizesToArray(
              &default_instance(), target, stream);
  target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
      this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  return target;
}